

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_window * nk_find_window(nk_context *ctx,nk_hash hash,char *name)

{
  nk_window *pnVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  pnVar1 = ctx->begin;
  do {
    if (pnVar1 == (nk_window *)0x0) {
      return (nk_window *)0x0;
    }
    if (pnVar1->name == hash) {
      if (pnVar1->name_string[0] == '\0') {
        lVar4 = 0;
      }
      else {
        lVar4 = 0;
        do {
          lVar2 = lVar4 + 1;
          lVar4 = lVar4 + 1;
        } while (pnVar1->name_string[lVar2] != '\0');
      }
      iVar3 = nk_stricmpn(pnVar1->name_string,name,(int)lVar4);
      if (iVar3 == 0) {
        return pnVar1;
      }
    }
    pnVar1 = pnVar1->next;
  } while( true );
}

Assistant:

NK_LIB struct nk_window*
nk_find_window(struct nk_context *ctx, nk_hash hash, const char *name)
{
struct nk_window *iter;
iter = ctx->begin;
while (iter) {
NK_ASSERT(iter != iter->next);
if (iter->name == hash) {
int max_len = nk_strlen(iter->name_string);
if (!nk_stricmpn(iter->name_string, name, max_len))
return iter;
}
iter = iter->next;
}
return 0;
}